

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

void __thiscall tsbp::Packing2D::AddItem(Packing2D *this,Rectangle *rectangle,int itemId)

{
  int itemId_local;
  Rectangle *rectangle_local;
  Packing2D *this_local;
  
  std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::emplace_back<tsbp::Rectangle>
            (&this->Items,rectangle);
  if (itemId != -1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (&this->PlacedItems,(long)itemId,true);
  }
  return;
}

Assistant:

void Packing2D::AddItem(Rectangle&& rectangle, int itemId)
{
    Items.emplace_back(std::move(rectangle));

    if (itemId == -1)
    {
        return;
    }

    PlacedItems.set((size_t)itemId);
}